

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int test_full_callback(uint _progress)

{
  shared_count sStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  char **local_20;
  
  g_executed = 1;
  local_48 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_48,0x1f6);
  sStack_80.pi_ = (sp_counted_base *)0x0;
  local_20 = &local_68;
  local_68 = "_progress >= g_prev_progress";
  local_60 = "";
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_0013f110;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_80);
  g_prev_progress = _progress;
  return 0;
}

Assistant:

static int test_full_callback(unsigned _progress)
{
	g_executed = true;
	BOOST_CHECK(_progress >= g_prev_progress);
	g_prev_progress = _progress;
	return 0;
}